

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

int __thiscall
ncnn::Mat::clone(Mat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  
  if ((*(long *)__fn == 0) ||
     (iVar1 = *(int *)(__fn + 0x2c), *(long *)(__fn + 0x30) * (long)iVar1 == 0)) {
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->c = 0;
    this->elemsize = 0;
    this->allocator = (Allocator *)0x0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->cstep = 0;
  }
  else {
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->c = 0;
    this->elemsize = 0;
    this->allocator = (Allocator *)0x0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->cstep = 0;
    iVar2 = *(int *)(__fn + 0x20);
    if (iVar2 == 3) {
      create(this,*(int *)(__fn + 0x24),*(int *)(__fn + 0x28),iVar1,*(size_t *)(__fn + 0x10),
             (Allocator *)__child_stack);
    }
    else if (iVar2 == 2) {
      create(this,*(int *)(__fn + 0x24),*(int *)(__fn + 0x28),*(size_t *)(__fn + 0x10),
             (Allocator *)__child_stack);
    }
    else if (iVar2 == 1) {
      iVar1 = *(int *)(__fn + 0x24);
      sVar4 = (size_t)iVar1;
      sVar3 = *(size_t *)(__fn + 0x10);
      this->data = (void *)0x0;
      this->refcount = (int *)0x0;
      this->elemsize = sVar3;
      this->allocator = (Allocator *)__child_stack;
      this->dims = 1;
      this->w = iVar1;
      this->h = 1;
      this->c = 1;
      this->cstep = sVar4;
      if (sVar4 != 0) {
        uVar7 = sVar3 * sVar4 + 3 & 0xfffffffffffffffc;
        if (__child_stack == (void *)0x0) {
          pvVar6 = malloc(uVar7 + 0x1c);
          pvVar5 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar5 - 8) = pvVar6;
        }
        else {
          pvVar5 = (void *)(*(code *)**__child_stack)(__child_stack,uVar7 + 4);
        }
        this->data = pvVar5;
        this->refcount = (int *)((long)pvVar5 + uVar7);
        *(undefined4 *)((long)pvVar5 + uVar7) = 1;
      }
    }
    if ((long)*(int *)(__fn + 0x2c) * *(long *)(__fn + 0x30) != 0) {
      memcpy(this->data,*(void **)__fn,
             (long)*(int *)(__fn + 0x2c) * *(long *)(__fn + 0x30) * *(long *)(__fn + 0x10));
    }
  }
  return (int)this;
}

Assistant:

inline Mat Mat::clone(Allocator* allocator) const
{
    if (empty())
        return Mat();

    Mat m;
    if (dims == 1)
        m.create(w, elemsize, allocator);
    else if (dims == 2)
        m.create(w, h, elemsize, allocator);
    else if (dims == 3)
        m.create(w, h, c, elemsize, allocator);

    if (total() > 0)
    {
        memcpy(m.data, data, total() * elemsize);
    }

    return m;
}